

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fir_filter.cc
# Opt level: O1

void __thiscall
webrtc::FIRFilterC::FIRFilterC(FIRFilterC *this,float *coefficients,size_t coefficients_length)

{
  ulong __n;
  float *pfVar1;
  float *__s;
  
  (this->super_FIRFilter)._vptr_FIRFilter = (_func_int **)&PTR__FIRFilterC_001cfa90;
  this->coefficients_length_ = coefficients_length;
  this->state_length_ = coefficients_length - 1;
  pfVar1 = (float *)operator_new__(-(ulong)(coefficients_length >> 0x3e != 0) |
                                   coefficients_length * 4);
  (this->coefficients_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  __n = coefficients_length * 4 - 4;
  __s = (float *)operator_new__(-(ulong)(coefficients_length - 1 >> 0x3e != 0) | __n);
  (this->state_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  if (coefficients_length != 0) {
    do {
      *pfVar1 = coefficients[coefficients_length - 1];
      pfVar1 = pfVar1 + 1;
      coefficients_length = coefficients_length - 1;
    } while (coefficients_length != 0);
  }
  memset(__s,0,__n);
  return;
}

Assistant:

FIRFilterC::FIRFilterC(const float* coefficients, size_t coefficients_length)
    : coefficients_length_(coefficients_length),
      state_length_(coefficients_length - 1),
      coefficients_(new float[coefficients_length_]),
      state_(new float[state_length_]) {
  for (size_t i = 0; i < coefficients_length_; ++i) {
    coefficients_[i] = coefficients[coefficients_length_ - i - 1];
  }
  memset(state_.get(), 0, state_length_ * sizeof(state_[0]));
}